

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

void arkInterpFree_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I)

{
  ARKodeMem in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  if (in_RSI != (ARKodeMem)0x0) {
    if (in_RSI->sunctx != (SUNContext_conflict)0x0) {
      if (*(long *)&in_RSI->sunctx->own_profiler != 0) {
        for (iVar1 = 0; iVar1 < *(int *)&in_RSI->sunctx->profiler; iVar1 = iVar1 + 1) {
          if (*(long *)(*(long *)&in_RSI->sunctx->own_profiler + (long)iVar1 * 8) != 0) {
            arkFreeVec(in_RSI,(N_Vector *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
            *(undefined8 *)(*(long *)&in_RSI->sunctx->own_profiler + (long)iVar1 * 8) = 0;
          }
        }
        free(*(void **)&in_RSI->sunctx->own_profiler);
        *(undefined8 *)&in_RSI->sunctx->own_profiler = 0;
      }
      if (in_RSI->sunctx->logger != (SUNLogger)0x0) {
        free(in_RSI->sunctx->logger);
        in_RSI->sunctx->logger = (SUNLogger)0x0;
      }
      *(long *)(in_RDI + 0x348) =
           *(long *)(in_RDI + 0x348) - (long)(*(int *)&in_RSI->sunctx->profiler + 1);
      *(long *)(in_RDI + 0x350) =
           *(long *)(in_RDI + 0x350) - (long)(*(int *)&in_RSI->sunctx->profiler + 2);
      free(in_RSI->sunctx);
      in_RSI->sunctx = (SUNContext_conflict)0x0;
    }
    if (in_RSI->uround != 0.0) {
      free((void *)in_RSI->uround);
      in_RSI->uround = 0.0;
    }
    free(in_RSI);
  }
  return;
}

Assistant:

void arkInterpFree_Lagrange(ARKodeMem ark_mem, ARKInterp I)
{
  int i;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) { return; }

  /* free content */
  if (I->content != NULL)
  {
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAX(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops)
  {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}